

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_AddIntrinsicMapSet(JSContext *ctx)

{
  JSValue obj;
  JSValue obj_00;
  JSValue obj_01;
  JSValue proto;
  char *pcVar1;
  JSValueUnion *pJVar2;
  long in_RDI;
  JSValue JVar3;
  char *name;
  char buf [64];
  JSValue obj1;
  int i;
  JSCFunctionEnum in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  JSValueUnion *in_stack_ffffffffffffff58;
  JSContext *in_stack_ffffffffffffff60;
  JSValueUnion in_stack_ffffffffffffff68;
  JSValueUnion in_stack_ffffffffffffff70;
  char *name_00;
  JSValueUnion ctx_00;
  JSValueUnion JVar4;
  JSValue in_stack_ffffffffffffff98;
  int local_c;
  
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    pcVar1 = JS_AtomGetStr((JSContext *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),0,
                           0x11f56c);
    in_stack_ffffffffffffff58 =
         (JSValueUnion *)(*(long *)(in_RDI + 0x40) + (long)(local_c + 0x1f) * 0x10);
    JVar3 = JS_NewObject((JSContext *)0x11f5a3);
    ctx_00 = JVar3.u;
    JVar4 = (JSValueUnion)JVar3.tag;
    in_stack_ffffffffffffff58->ptr = (void *)ctx_00;
    in_stack_ffffffffffffff58[1].ptr = (void *)JVar4;
    obj.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
    obj.u.ptr = in_stack_ffffffffffffff68.ptr;
    JS_SetPropertyFunctionList
              (in_stack_ffffffffffffff60,obj,(JSCFunctionListEntry *)in_stack_ffffffffffffff58,
               in_stack_ffffffffffffff54);
    JVar3 = JS_NewCFunctionMagic
                      (in_stack_ffffffffffffff60,(undefined1 *)in_stack_ffffffffffffff58,
                       (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,0);
    in_stack_ffffffffffffff70 = JVar3.u;
    name_00 = (char *)JVar3.tag;
    if (local_c < 2) {
      obj_00.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
      obj_00.u.ptr = in_stack_ffffffffffffff68.ptr;
      JS_SetPropertyFunctionList
                (in_stack_ffffffffffffff60,obj_00,(JSCFunctionListEntry *)in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff54);
    }
    proto.tag = (int64_t)pcVar1;
    proto.u.float64 = JVar4.float64;
    JS_NewGlobalCConstructor2((JSContext *)ctx_00.ptr,in_stack_ffffffffffffff98,name_00,proto);
  }
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    pJVar2 = (JSValueUnion *)(*(long *)(in_RDI + 0x40) + (long)(local_c + 0x23) * 0x10);
    JVar3.u._4_4_ = in_stack_ffffffffffffff4c;
    JVar3.u.int32 = in_stack_ffffffffffffff48;
    JVar3.tag._0_4_ = (int)pJVar2;
    JVar3.tag._4_4_ = (int)((ulong)pJVar2 >> 0x20);
    JVar3 = JS_NewObjectProto((JSContext *)0x11f762,JVar3);
    pJVar2->ptr = (void *)JVar3.u;
    pJVar2[1].ptr = (void *)JVar3.tag;
    obj_01.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
    obj_01.u = (JSValueUnion)(JSValueUnion)JVar3.tag;
    JS_SetPropertyFunctionList
              ((JSContext *)JVar3.u.ptr,obj_01,(JSCFunctionListEntry *)in_stack_ffffffffffffff58,
               (int)((ulong)pJVar2 >> 0x20));
  }
  return;
}

Assistant:

void JS_AddIntrinsicMapSet(JSContext *ctx)
{
    int i;
    JSValue obj1;
    char buf[ATOM_GET_STR_BUF_SIZE];

    for(i = 0; i < 4; i++) {
        const char *name = JS_AtomGetStr(ctx, buf, sizeof(buf),
                                         JS_ATOM_Map + i);
        ctx->class_proto[JS_CLASS_MAP + i] = JS_NewObject(ctx);
        JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_MAP + i],
                                   js_map_proto_funcs_ptr[i],
                                   js_map_proto_funcs_count[i]);
        obj1 = JS_NewCFunctionMagic(ctx, js_map_constructor, name, 0,
                                    JS_CFUNC_constructor_magic, i);
        if (i < 2) {
            JS_SetPropertyFunctionList(ctx, obj1, js_map_funcs,
                                       countof(js_map_funcs));
        }
        JS_NewGlobalCConstructor2(ctx, obj1, name, ctx->class_proto[JS_CLASS_MAP + i]);
    }

    for(i = 0; i < 2; i++) {
        ctx->class_proto[JS_CLASS_MAP_ITERATOR + i] =
            JS_NewObjectProto(ctx, ctx->iterator_proto);
        JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_MAP_ITERATOR + i],
                                   js_map_proto_funcs_ptr[i + 4],
                                   js_map_proto_funcs_count[i + 4]);
    }
}